

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindEnumCodeFunction
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  undefined1 uVar2;
  reference pvVar3;
  type expr;
  pointer pEVar4;
  BinderException *this_00;
  InternalException *this_01;
  allocator local_41;
  LogicalType local_40 [32];
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (pvVar3);
  CheckEnumParameter(expr);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if (pEVar4[0x38] == (Expression)0x68) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    uVar2 = duckdb::EnumType::GetPhysicalType((LogicalType *)(pEVar4 + 0x38));
    switch(uVar2) {
    case 2:
      LVar1 = UTINYINT;
      break;
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)local_40,"Unsupported Enum Internal Type",&local_41);
      duckdb::InternalException::InternalException(this_01,(string *)local_40);
      __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    case 4:
      LVar1 = USMALLINT;
      break;
    case 6:
      LVar1 = UINTEGER;
      break;
    case 8:
      LVar1 = UBIGINT;
    }
    duckdb::LogicalType::LogicalType(local_40,LVar1);
    LogicalType::operator=((LogicalType *)&bound_function->field_0x90,local_40);
    duckdb::LogicalType::~LogicalType(local_40);
    *(undefined8 *)this = 0;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)local_40,"This function needs an ENUM as an argument",&local_41);
  duckdb::BinderException::BinderException(this_00,(string *)local_40);
  __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindEnumCodeFunction(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	CheckEnumParameter(*arguments[0]);
	if (arguments[0]->return_type.id() != LogicalTypeId::ENUM) {
		throw BinderException("This function needs an ENUM as an argument");
	}

	auto phy_type = EnumType::GetPhysicalType(arguments[0]->return_type);
	switch (phy_type) {
	case PhysicalType::UINT8:
		bound_function.return_type = LogicalType(LogicalTypeId::UTINYINT);
		break;
	case PhysicalType::UINT16:
		bound_function.return_type = LogicalType(LogicalTypeId::USMALLINT);
		break;
	case PhysicalType::UINT32:
		bound_function.return_type = LogicalType(LogicalTypeId::UINTEGER);
		break;
	case PhysicalType::UINT64:
		bound_function.return_type = LogicalType(LogicalTypeId::UBIGINT);
		break;
	default:
		throw InternalException("Unsupported Enum Internal Type");
	}

	return nullptr;
}